

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall
vmtz_rule::resolve(vmtz_rule *this,int32_t *dayno,int32_t *daytime,int year,vmtz_rule *prev_rule)

{
  int32_t iVar1;
  int in_ECX;
  int32_t *daytime_00;
  int *in_RDX;
  int32_t *in_RSI;
  long in_RDI;
  long in_R8;
  caldate_t cd;
  int delta;
  int w;
  int32_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  caldate_t::caldate_t((caldate_t *)&stack0xffffffffffffffc4,in_ECX,(int)*(char *)(in_RDI + 0x10),0)
  ;
  daytime_00 = (int32_t *)(ulong)(uint)(int)*(char *)(in_RDI + 0x11);
  switch(daytime_00) {
  case (int32_t *)0x0:
    break;
  case (int32_t *)0x1:
    in_stack_ffffffffffffffd4 = caldate_t::weekday((caldate_t *)&stack0xffffffffffffffc4);
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd4 - *(char *)(in_RDI + 0x14);
    if (in_stack_ffffffffffffffd0 < 0) {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 7;
    }
    break;
  case (int32_t *)0x2:
    in_stack_ffffffffffffffd4 = caldate_t::weekday((caldate_t *)&stack0xffffffffffffffc4);
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
    in_stack_ffffffffffffffd0 = *(char *)(in_RDI + 0x14) - in_stack_ffffffffffffffd4;
    if (in_stack_ffffffffffffffd0 < 0) {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 7;
    }
    break;
  case (int32_t *)0x3:
    in_stack_ffffffffffffffd4 = caldate_t::weekday((caldate_t *)&stack0xffffffffffffffc4);
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
    in_stack_ffffffffffffffd0 = *(char *)(in_RDI + 0x14) - in_stack_ffffffffffffffd4;
    if (in_stack_ffffffffffffffd0 < 0) {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 7;
    }
  }
  iVar1 = caldate_t::dayno((caldate_t *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *in_RSI = iVar1;
  *in_RDX = *(int *)(in_RDI + 0x18);
  if (*(char *)(in_RDI + 0x15) == '\0') {
    *in_RDX = *in_RDX - (*(int *)(in_R8 + 8) + *(int *)(in_R8 + 0xc));
  }
  else if (*(char *)(in_RDI + 0x15) == '@') {
    *in_RDX = *in_RDX - *(int *)(in_R8 + 8);
  }
  caldate_t::normalize(in_stack_ffffffffffffffc0,daytime_00);
  return;
}

Assistant:

void vmtz_rule::resolve(int32_t &dayno, int32_t &daytime, int year,
                        const vmtz_rule *prev_rule)
{
    /* set up our year and month; we have yet to work out the day */
    int w, delta;
    caldate_t cd(year, mm, 0);

    /* figure out the day according to our type */
    switch (when)
    {
    case 0:
        /* the rule takes effect on a the fixed day 'dd' */
        cd.d = dd;
        break;

    case 1:
        /* 
         *   The rule takes effect on the last <weekday> of the month.  Get
         *   the weekday of the last day of this month (which we can figure
         *   using day 0 of next month). 
         */
        cd.m += 1;
        w = cd.weekday() + 1;

        /* figure the days from mm/last to the previous target weekday */
        delta = w - weekday;
        if (delta < 0)
            delta += 7;

        /* go back that many days */
        cd.d -= delta;
        break;

    case 2:
        /* first <weekday> on or after <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure days between <dd> and the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days */
        cd.d += delta;
        break;

    case 3:
        /* first <weekday> on or before <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure the days from <dd> to the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days and back a week */
        cd.d += delta - 7;
        break;
    }

    /* we now have our effective date and time */
    dayno = cd.dayno();
    daytime = at;

    /* adjust the time zone */
    switch (at_zone)
    {
    case 0x80:
        /* the rule was stated in UTC, which is what we're after */
        break;

    case 0x00:
        /* 
         *   The rule was stated in local wall clock time, in the period in
         *   effect just before the rule.  That means we use the zone
         *   settings of the *previous* rule, which defines the period
         *   leading up to this rule's firing time.  Convert to UTC by
         *   subtracting the standard time offset plus the daylight offset
         *   for the prior period.
         */
        daytime -= prev_rule->gmtofs + prev_rule->save;
        break;

    case 0x40:
        /* 
         *   the rule was stated in local standard time, so subtract the
         *   standard time offset for the prior period 
         */
        daytime -= prev_rule->gmtofs;
        break;
    }

    /* normalize the time to keep it within 0-23:59:59 */
    caldate_t::normalize(dayno, daytime);
}